

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               DeploymentPos id)

{
  bool bVar1;
  ThresholdState TVar2;
  ThresholdState TVar3;
  long in_RDX;
  VersionBitsCache *in_RDI;
  long in_FS_OFFSET;
  iterator iVar4;
  reference rVar5;
  bool s;
  vector<bool,_std::allocator<bool>_> *__range2;
  bool has_signal;
  ThresholdState current_state;
  ThresholdState next_state;
  BIP9Stats statsStruct;
  anon_class_1_0_00000001 get_state_name;
  iterator __end2;
  iterator __begin2;
  vector<bool,_std::allocator<bool>_> signals;
  UniValue rv;
  string sig;
  UniValue statsUV;
  UniValue bip9;
  ChainstateManager *in_stack_fffffffffffff2d8;
  UniValue *in_stack_fffffffffffff2e0;
  UniValue *in_stack_fffffffffffff2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2f0;
  UniValue *in_stack_fffffffffffff2f8;
  Params *in_stack_fffffffffffff300;
  DeploymentPos DVar6;
  Params *in_stack_fffffffffffff308;
  CBlockIndex *in_stack_fffffffffffff310;
  VersionBitsCache *in_stack_fffffffffffff318;
  undefined4 in_stack_fffffffffffff320;
  int in_stack_fffffffffffff324;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff328;
  undefined8 in_stack_fffffffffffff330;
  ThresholdState state;
  anon_class_1_0_00000001 *in_stack_fffffffffffff338;
  allocator<char> local_b6b;
  undefined1 local_b6a;
  allocator<char> local_b69;
  int local_b68;
  undefined1 local_b63 [2];
  allocator<char> local_b61;
  reference local_b60;
  undefined8 local_b50;
  undefined4 local_b48;
  _Bit_type *local_b40;
  uint local_b38;
  allocator<char> local_b2a;
  allocator<char> local_b29;
  allocator<char> local_b28;
  allocator<char> local_b27;
  allocator<char> local_b26;
  allocator<char> local_b25 [24];
  allocator<char> local_b0d;
  int local_b0c;
  allocator<char> local_b07;
  allocator<char> local_b06;
  allocator<char> local_b05;
  allocator<char> local_b04;
  allocator<char> local_b03;
  allocator<char> local_b02;
  undefined1 local_b01;
  _Bit_type *local_b00;
  uint local_af8;
  _Bit_type *local_af0;
  uint local_ae8;
  UniValue local_ab8 [31];
  long local_8;
  
  state = (ThresholdState)((ulong)in_stack_fffffffffffff330 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = DeploymentEnabled<Consensus::DeploymentPos>
                    (in_stack_fffffffffffff2d8,DEPLOYMENT_TESTDUMMY);
  rVar5._M_mask = local_b60._M_mask;
  rVar5._M_p = local_b60._M_p;
  if ((bVar1) && (local_b60 = rVar5, in_RDI != (VersionBitsCache *)0x0)) {
    local_b01 = 0;
    std::__cxx11::string::string(in_stack_fffffffffffff2f0);
    UniValue::UniValue(in_stack_fffffffffffff2f8,(VType)((ulong)in_stack_fffffffffffff2f0 >> 0x20),
                       (string *)in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    TVar2 = VersionBitsCache::State
                      (in_stack_fffffffffffff318,in_stack_fffffffffffff310,in_stack_fffffffffffff308
                       ,(DeploymentPos)((ulong)in_stack_fffffffffffff300 >> 0x30));
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    TVar3 = VersionBitsCache::State
                      (in_stack_fffffffffffff318,in_stack_fffffffffffff310,in_stack_fffffffffffff308
                       ,(DeploymentPos)((ulong)in_stack_fffffffffffff300 >> 0x30));
    if (TVar3 == STARTED || TVar3 == LOCKED_IN) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
      UniValue::UniValue<const_int_&,_int,_true>
                ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(&local_b02);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    UniValue::UniValue<const_long_&,_long,_true>
              ((UniValue *)in_stack_fffffffffffff318,(long *)in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b03);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    UniValue::UniValue<const_long_&,_long,_true>
              ((UniValue *)in_stack_fffffffffffff318,(long *)in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b04);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    UniValue::UniValue<const_int_&,_int,_true>
              ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b05);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    SoftForkDescPushBack(CBlockIndex_const*,UniValue&,ChainstateManager_const&,Consensus::DeploymentPos)
    ::$_0::operator()[abi_cxx11_(in_stack_fffffffffffff338,state);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)in_stack_fffffffffffff318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b06);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
    local_b0c = VersionBitsCache::StateSinceHeight
                          (in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                           in_stack_fffffffffffff308,
                           (DeploymentPos)((ulong)in_stack_fffffffffffff300 >> 0x30));
    UniValue::UniValue<int,_int,_true>
              ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    SoftForkDescPushBack(CBlockIndex_const*,UniValue&,ChainstateManager_const&,Consensus::DeploymentPos)
    ::$_0::operator()[abi_cxx11_(in_stack_fffffffffffff338,state);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)in_stack_fffffffffffff318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b0d);
    if (TVar3 == STARTED || TVar3 == LOCKED_IN) {
      std::__cxx11::string::string(in_stack_fffffffffffff2f0);
      UniValue::UniValue(in_stack_fffffffffffff2f8,(VType)((ulong)in_stack_fffffffffffff2f0 >> 0x20)
                         ,(string *)in_stack_fffffffffffff2e8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2d8);
      ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
      VersionBitsCache::Statistics
                ((CBlockIndex *)in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                 (DeploymentPos)((ulong)in_stack_fffffffffffff2f8 >> 0x30),
                 (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      UniValue::UniValue<int_&,_int,_true>
                ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(local_b25);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      UniValue::UniValue<int_&,_int,_true>
                ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(&local_b26);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      UniValue::UniValue<int_&,_int,_true>
                ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(&local_b27);
      if (TVar3 != LOCKED_IN) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff328,
                   (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                   (allocator<char> *)in_stack_fffffffffffff318);
        UniValue::UniValue<int_&,_int,_true>
                  ((UniValue *)in_stack_fffffffffffff318,(int *)in_stack_fffffffffffff310);
        UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                         (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff2d8);
        std::allocator<char>::~allocator(&local_b28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff328,
                   (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                   (allocator<char> *)in_stack_fffffffffffff318);
        UniValue::UniValue<bool_&,_bool,_true>
                  ((UniValue *)in_stack_fffffffffffff318,(bool *)in_stack_fffffffffffff310);
        UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                         (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff2d8);
        std::allocator<char>::~allocator(&local_b29);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      UniValue::UniValue(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(&local_b2a);
      std::__cxx11::string::string(in_stack_fffffffffffff2f0);
      std::vector<bool,_std::allocator<bool>_>::size
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff300,(size_type)in_stack_fffffffffffff308);
      iVar4 = std::vector<bool,_std::allocator<bool>_>::begin
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2e8);
      local_b40 = iVar4.super__Bit_iterator_base._M_p;
      local_b38 = iVar4.super__Bit_iterator_base._M_offset;
      local_af0 = local_b40;
      local_ae8 = local_b38;
      iVar4 = std::vector<bool,_std::allocator<bool>_>::end
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2e8);
      local_b50 = iVar4.super__Bit_iterator_base._M_p;
      local_b48 = iVar4.super__Bit_iterator_base._M_offset;
      local_b00 = (_Bit_type *)local_b50;
      local_af8 = local_b48;
      while( true ) {
        bVar1 = std::operator==((_Bit_iterator_base *)in_stack_fffffffffffff2e8,
                                (_Bit_iterator_base *)in_stack_fffffffffffff2e0);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        rVar5 = std::_Bit_iterator::operator*((_Bit_iterator *)in_stack_fffffffffffff2e8);
        local_b60 = rVar5;
        std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)in_stack_fffffffffffff2d8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffff2f0,(char)((ulong)in_stack_fffffffffffff2f8 >> 0x38));
        std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffff2d8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)in_stack_fffffffffffff318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator(&local_b61);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff2d8);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    }
    DVar6 = (DeploymentPos)((ulong)in_stack_fffffffffffff300 >> 0x30);
    std::__cxx11::string::string(in_stack_fffffffffffff2f0);
    UniValue::UniValue(in_stack_fffffffffffff2f8,(VType)((ulong)in_stack_fffffffffffff2f0 >> 0x20),
                       (string *)in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    UniValue::UniValue<const_char_(&)[5],_char[5],_true>
              ((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (char (*) [5])in_stack_fffffffffffff318);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator((allocator<char> *)(local_b63 + 1));
    if (TVar2 == ACTIVE) {
      in_stack_fffffffffffff328 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b63;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff328,
                 (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                 (allocator<char> *)in_stack_fffffffffffff318);
      in_stack_fffffffffffff310 = (CBlockIndex *)(in_RDX + 0xd00);
      ChainstateManager::GetConsensus(in_stack_fffffffffffff2d8);
      in_stack_fffffffffffff324 =
           VersionBitsCache::StateSinceHeight
                     (in_RDI,in_stack_fffffffffffff310,in_stack_fffffffffffff308,DVar6);
      local_b68 = in_stack_fffffffffffff324;
      UniValue::UniValue<int,_int,_true>((UniValue *)in_RDI,(int *)in_stack_fffffffffffff310);
      UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                       (string *)in_RDI,(UniValue *)in_stack_fffffffffffff310);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2d8);
      std::allocator<char>::~allocator((allocator<char> *)local_b63);
      in_stack_fffffffffffff318 = in_RDI;
    }
    DVar6 = (DeploymentPos)((ulong)&local_b69 >> 0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    local_b6a = TVar2 == ACTIVE;
    UniValue::UniValue<bool,_bool,_true>
              ((UniValue *)in_stack_fffffffffffff318,(bool *)in_stack_fffffffffffff310);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff328,
               (char *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
               (allocator<char> *)in_stack_fffffffffffff318);
    UniValue::UniValue(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    std::allocator<char>::~allocator(&local_b6b);
    DeploymentName_abi_cxx11_(DVar6);
    UniValue::UniValue(local_ab8,in_stack_fffffffffffff2e0);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
                     (string *)in_stack_fffffffffffff318,(UniValue *)in_stack_fffffffffffff310);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2d8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff2d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::DeploymentPos id)
{
    // For BIP9 deployments.

    if (!DeploymentEnabled(chainman, id)) return;
    if (blockindex == nullptr) return;

    auto get_state_name = [](const ThresholdState state) -> std::string {
        switch (state) {
        case ThresholdState::DEFINED: return "defined";
        case ThresholdState::STARTED: return "started";
        case ThresholdState::LOCKED_IN: return "locked_in";
        case ThresholdState::ACTIVE: return "active";
        case ThresholdState::FAILED: return "failed";
        }
        return "invalid";
    };

    UniValue bip9(UniValue::VOBJ);

    const ThresholdState next_state = chainman.m_versionbitscache.State(blockindex, chainman.GetConsensus(), id);
    const ThresholdState current_state = chainman.m_versionbitscache.State(blockindex->pprev, chainman.GetConsensus(), id);

    const bool has_signal = (ThresholdState::STARTED == current_state || ThresholdState::LOCKED_IN == current_state);

    // BIP9 parameters
    if (has_signal) {
        bip9.pushKV("bit", chainman.GetConsensus().vDeployments[id].bit);
    }
    bip9.pushKV("start_time", chainman.GetConsensus().vDeployments[id].nStartTime);
    bip9.pushKV("timeout", chainman.GetConsensus().vDeployments[id].nTimeout);
    bip9.pushKV("min_activation_height", chainman.GetConsensus().vDeployments[id].min_activation_height);

    // BIP9 status
    bip9.pushKV("status", get_state_name(current_state));
    bip9.pushKV("since", chainman.m_versionbitscache.StateSinceHeight(blockindex->pprev, chainman.GetConsensus(), id));
    bip9.pushKV("status_next", get_state_name(next_state));

    // BIP9 signalling status, if applicable
    if (has_signal) {
        UniValue statsUV(UniValue::VOBJ);
        std::vector<bool> signals;
        BIP9Stats statsStruct = chainman.m_versionbitscache.Statistics(blockindex, chainman.GetConsensus(), id, &signals);
        statsUV.pushKV("period", statsStruct.period);
        statsUV.pushKV("elapsed", statsStruct.elapsed);
        statsUV.pushKV("count", statsStruct.count);
        if (ThresholdState::LOCKED_IN != current_state) {
            statsUV.pushKV("threshold", statsStruct.threshold);
            statsUV.pushKV("possible", statsStruct.possible);
        }
        bip9.pushKV("statistics", std::move(statsUV));

        std::string sig;
        sig.reserve(signals.size());
        for (const bool s : signals) {
            sig.push_back(s ? '#' : '-');
        }
        bip9.pushKV("signalling", sig);
    }

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "bip9");
    if (ThresholdState::ACTIVE == next_state) {
        rv.pushKV("height", chainman.m_versionbitscache.StateSinceHeight(blockindex, chainman.GetConsensus(), id));
    }
    rv.pushKV("active", ThresholdState::ACTIVE == next_state);
    rv.pushKV("bip9", std::move(bip9));

    softforks.pushKV(DeploymentName(id), std::move(rv));
}